

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch.cpp
# Opt level: O3

interval_t __thiscall
duckdb::NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>
          (NormalizedIntervalOperator *this,interval_t input)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  interval_t iVar5;
  
  lVar3 = ((long)this >> 0x20) + input._0_8_ / 86400000000;
  lVar1 = lVar3 % 0x1e;
  uVar4 = (long)(int)this + lVar3 / 0x1e;
  if ((long)uVar4 < 0x80000000) {
    if ((long)uVar4 < -0x80000000) {
      lVar1 = lVar1 + uVar4 * 0x1e + 0xf00000000;
      uVar4 = 0x80000000;
    }
    else {
      uVar4 = uVar4 & 0xffffffff;
    }
  }
  else {
    lVar1 = lVar1 + uVar4 * 0x1e + -0xeffffffe2;
    uVar4 = 0x7fffffff;
  }
  lVar3 = input._0_8_ % 86400000000;
  if (lVar1 < 0x80000000) {
    if (lVar1 < -0x80000000) {
      lVar3 = lVar3 + 0xeebb00000000000 + lVar1 * 86400000000;
      uVar2 = 0x8000000000000000;
    }
    else {
      uVar2 = lVar1 << 0x20;
    }
  }
  else {
    lVar3 = lVar3 + -0xeebafebe228a000 + lVar1 * 86400000000;
    uVar2 = 0x7fffffff00000000;
  }
  iVar5._0_8_ = uVar2 | uVar4;
  iVar5.micros = lVar3;
  return iVar5;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input) {
		return input.Normalize();
	}